

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portioner.cpp
# Opt level: O0

void __thiscall Portioner::make_Portion(Portioner *this)

{
  bool bVar1;
  pointer pPVar2;
  reference __x;
  size_type sVar3;
  ostream *poVar4;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_68 [3];
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> local_50;
  iterator it;
  vector<Point_d,_std::allocator<Point_d>_> bucket;
  int local_28;
  int xbmax;
  int xbmin;
  int ybmax;
  int ybmin;
  int maxbucketsize;
  int minbucketsize;
  int bucketcounter;
  Portioner *this_local;
  
  maxbucketsize = 0;
  ybmin = 99999;
  ybmax = 0;
  xbmin = 0;
  for (xbmax = this->_Y_Bucketsize; xbmax <= this->_height; xbmax = xbmax + this->_Y_Bucketsize) {
    local_28 = 0;
    bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = this->_X_Bucketsize;
    while (bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ <= this->_width) {
      std::vector<Point_d,_std::allocator<Point_d>_>::vector
                ((vector<Point_d,_std::allocator<Point_d>_> *)&it);
      local_50._M_current =
           (Point_d *)
           std::begin<std::vector<Point_d,std::allocator<Point_d>>>(&this->_random_points);
      while( true ) {
        local_68[0]._M_current =
             (Point_d *)
             std::end<std::vector<Point_d,std::allocator<Point_d>>>(&this->_random_points);
        bVar1 = __gnu_cxx::operator!=(&local_50,local_68);
        if (!bVar1) break;
        pPVar2 = __gnu_cxx::
                 __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
                 operator->(&local_50);
        if ((((pPVar2->x <
               (double)bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_) &&
             (pPVar2 = __gnu_cxx::
                       __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>
                       ::operator->(&local_50), (double)local_28 <= pPVar2->x)) &&
            (pPVar2 = __gnu_cxx::
                      __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>
                      ::operator->(&local_50), pPVar2->y < (double)xbmax)) &&
           (pPVar2 = __gnu_cxx::
                     __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
                     operator->(&local_50), (double)xbmin <= pPVar2->y)) {
          __x = __gnu_cxx::
                __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
                operator*(&local_50);
          std::vector<Point_d,_std::allocator<Point_d>_>::push_back
                    ((vector<Point_d,_std::allocator<Point_d>_> *)&it,__x);
        }
        __gnu_cxx::__normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_>::
        operator++(&local_50);
      }
      sVar3 = std::vector<Point_d,_std::allocator<Point_d>_>::size
                        ((vector<Point_d,_std::allocator<Point_d>_> *)&it);
      if (sVar3 < (ulong)(long)ybmin) {
        sVar3 = std::vector<Point_d,_std::allocator<Point_d>_>::size
                          ((vector<Point_d,_std::allocator<Point_d>_> *)&it);
        ybmin = (int)sVar3;
      }
      sVar3 = std::vector<Point_d,_std::allocator<Point_d>_>::size
                        ((vector<Point_d,_std::allocator<Point_d>_> *)&it);
      if ((ulong)(long)ybmax < sVar3) {
        sVar3 = std::vector<Point_d,_std::allocator<Point_d>_>::size
                          ((vector<Point_d,_std::allocator<Point_d>_> *)&it);
        ybmax = (int)sVar3;
      }
      std::
      vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
      ::push_back(&this->_point_buckets,(value_type *)&it);
      maxbucketsize = maxbucketsize + 1;
      local_28 = local_28 + this->_X_Bucketsize;
      bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + this->_X_Bucketsize;
      std::vector<Point_d,_std::allocator<Point_d>_>::~vector
                ((vector<Point_d,_std::allocator<Point_d>_> *)&it);
    }
    xbmin = xbmin + this->_Y_Bucketsize;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"es gibt ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,maxbucketsize);
  poVar4 = std::operator<<(poVar4," Buckets. ");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Bucketmaxsize ist  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ybmax);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Bucketminsize ist  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,ybmin);
  std::operator<<(poVar4,"\n");
  return;
}

Assistant:

void Portioner::make_Portion()
{
  int bucketcounter = 0;
  int minbucketsize = 99999;
  int maxbucketsize = 0;
//  std::vector<std::vector<Point_d>>Point_bucket;
  int ybmin = 0;
  int ybmax = _Y_Bucketsize;
  //std::cout << "ybmin is now: " <<ybmin<< "  . " <<"\n";
  //std::cout << "ybmax is now" <<ybmax<< "  . " <<"\n";
  while(ybmax <= _height)
    {
      //std::cout << "outer while loop starts: ----------------------" <<"\n";
      int xbmin = 0;
      int xbmax = _X_Bucketsize;
      //std::cout << "xbmin is now: " <<xbmin<< "  . " <<"\n";
      //std::cout << "xbmax is now" <<xbmax<< "  . " <<"\n";
      while(xbmax <=_width)
      {
        std::vector<Point_d>bucket;
        for(auto it = std::begin(_random_points); it!=std::end(_random_points); ++it){
          if(it->x < xbmax && it->x >= xbmin){
            if(it->y < ybmax && it->y >= ybmin){
              //noch ganz schön langsam da random_points nicht kleiner wird
              bucket.push_back(*it);
            }
          }
        }
        //std::cout << "Bucket ist mit  " <<bucket.size()<< " gefüllt. " <<"\n";
        if(minbucketsize > bucket.size())minbucketsize = bucket.size();
        if(maxbucketsize < bucket.size())maxbucketsize = bucket.size();
        _point_buckets.push_back(bucket);
        bucketcounter += 1;
        xbmin = xbmin+_X_Bucketsize;
        xbmax = xbmax+_X_Bucketsize;
        //std::cout << "xbmin is now: " <<xbmin<< "  . " <<"\n";
        //std::cout << "xbmax is now" <<xbmax<< "  . " <<"\n";
      }
      //std::cout << "left inner while loop:    -->>-<-<-<-<-<-<-<-<-<-<-<-     " <<"\n";
      xbmin = 0;
      xbmax = 0 + _X_Bucketsize;
      //std::cout << "xbmin is now: " <<xbmin<< "  . " <<"\n";
      //std::cout << "xbmax is now" <<xbmax<< "  . " <<"\n";
      ybmin = ybmin + _Y_Bucketsize;
      ybmax = ybmax + _Y_Bucketsize;
      //std::cout << "ybmin is now: " <<ybmin<< "  . " <<"\n";
      //std::cout << "ybmax is now" <<ybmax<< "  . " <<"\n";

    }
    std::cout << "es gibt " <<bucketcounter<< " Buckets. " <<"\n";
    std::cout << "Bucketmaxsize ist  " << maxbucketsize  <<"\n";
    std::cout << "Bucketminsize ist  " << minbucketsize  <<"\n";


    //return _point_buckets;
    return;
}